

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleanimation.cpp
# Opt level: O0

void __thiscall QBlendStyleAnimation::updateCurrentTime(QBlendStyleAnimation *this,int time)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int in_ESI;
  long *in_RDI;
  long in_FS_OFFSET;
  float alpha;
  float in_stack_0000003c;
  QImage *in_stack_00000040;
  QImage *in_stack_00000048;
  QImage *other;
  int in_stack_ffffffffffffffb8;
  float in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int local_2c;
  QImage local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QStyleAnimation::updateCurrentTime
            ((QStyleAnimation *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             (int)in_stack_ffffffffffffffbc);
  iVar1 = (**(code **)(*in_RDI + 0x60))();
  if (iVar1 < 1) {
    if (0 < in_ESI) {
      QAbstractAnimation::stop();
    }
  }
  else {
    local_2c = in_ESI;
    if (*(int *)((long)in_RDI + 0x24) == 1) {
      iVar2 = (**(code **)(*in_RDI + 0x60))();
      local_2c = (in_ESI % iVar2) * 2;
      iVar1 = local_2c;
      iVar3 = (**(code **)(*in_RDI + 0x60))();
      if (iVar3 < iVar1) {
        iVar1 = (**(code **)(*in_RDI + 0x60))();
        local_2c = iVar1 * 2 + (in_ESI % iVar2) * -2;
      }
    }
    in_stack_ffffffffffffffbc = (float)local_2c;
    (**(code **)(*in_RDI + 0x60))();
    if ((*(int *)((long)in_RDI + 0x24) == 0) &&
       (iVar1 = (**(code **)(*in_RDI + 0x60))(), in_stack_ffffffffffffffb8 = local_2c,
       iVar1 < local_2c)) {
      QAbstractAnimation::stop();
      in_stack_ffffffffffffffb8 = local_2c;
    }
  }
  other = local_20;
  blendedImage(in_stack_00000048,in_stack_00000040,in_stack_0000003c);
  QImage::operator=((QImage *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),other);
  QImage::~QImage(other);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QBlendStyleAnimation::updateCurrentTime(int time)
{
    QStyleAnimation::updateCurrentTime(time);

    float alpha = 1.0;
    if (duration() > 0) {
        if (_type == Pulse) {
            time = time % duration() * 2;
            if (time > duration())
                time = duration() * 2 - time;
        }

        alpha = time / static_cast<float>(duration());

        if (_type == Transition && time > duration()) {
            alpha = 1.0;
            stop();
        }
    } else if (time > 0) {
        stop();
    }

    _current = blendedImage(_start, _end, alpha);
}